

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O0

bool __thiscall hittable_list::hit(hittable_list *this,ray *r,interval ray_t,hit_record *rec)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  interval local_c0;
  __shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_b0;
  shared_ptr<hittable> *object;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *__range1;
  double closest_so_far;
  undefined1 local_80 [7];
  bool hit_anything;
  hit_record temp_rec;
  hit_record *rec_local;
  ray *r_local;
  hittable_list *this_local;
  interval ray_t_local;
  
  __range1 = (vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *)
             ray_t.max;
  temp_rec._72_8_ = rec;
  hit_record::hit_record((hit_record *)local_80);
  closest_so_far._7_1_ = false;
  __end1 = std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::
           begin(&this->objects);
  object = (shared_ptr<hittable> *)
           std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::end
                     (&this->objects);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
                                     *)&object), bVar1) {
    local_b0 = (__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
               ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<hittable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_b0);
    interval::interval(&local_c0,ray_t.min,(double)__range1);
    uVar2 = (*peVar3->_vptr_hittable[2])(local_c0.min,local_c0.max,peVar3,r,local_80);
    if ((uVar2 & 1) != 0) {
      closest_so_far._7_1_ = true;
      __range1 = (vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *)
                 temp_rec.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      hit_record::operator=((hit_record *)temp_rec._72_8_,(hit_record *)local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<hittable>_*,_std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>_>
    ::operator++(&__end1);
  }
  hit_record::~hit_record((hit_record *)local_80);
  return closest_so_far._7_1_;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record temp_rec;
        bool hit_anything = false;
        auto closest_so_far = ray_t.max;

        for (const auto& object : objects) {
            if (object->hit(r, interval(ray_t.min, closest_so_far), temp_rec)) {
                hit_anything = true;
                closest_so_far = temp_rec.t;
                rec = temp_rec;
            }
        }

        return hit_anything;
    }